

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

bool are_equal(string_view lhs,string_view rhs)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  sVar3 = rhs._M_len;
  if (sVar3 != lhs._M_len) {
    return false;
  }
  if (sVar3 == 0) {
    bVar5 = true;
  }
  else {
    lVar4 = 0;
    do {
      iVar1 = tolower((int)lhs._M_str[lVar4]);
      iVar2 = tolower((int)rhs._M_str[lVar4]);
      bVar5 = iVar1 == iVar2;
      if (!bVar5) {
        return bVar5;
      }
      bVar6 = sVar3 - 1 != lVar4;
      lVar4 = lVar4 + 1;
    } while (bVar6);
  }
  return bVar5;
}

Assistant:

constexpr bool
are_equal(const std::string_view lhs, const std::string_view rhs) noexcept
{
    if (rhs.size() != lhs.size())
        return false;

    std::string_view::size_type i = 0;
    std::string_view::size_type e = lhs.size();

    for (; i != e; ++i)
        if (std::tolower(lhs[i]) != std::tolower(rhs[i]))
            return false;

    return true;
}